

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O0

_Bool read_dev_urandom(char *buf,int len)

{
  int __fd;
  ssize_t sVar1;
  int local_24;
  int ret;
  int ngot;
  int fd;
  int len_local;
  char *buf_local;
  
  __fd = open("/dev/urandom",0);
  if (__fd < 0) {
    buf_local._7_1_ = false;
  }
  else {
    for (local_24 = 0; local_24 < len; local_24 = (int)sVar1 + local_24) {
      sVar1 = read(__fd,buf + local_24,(long)(len - local_24));
      if ((int)sVar1 < 0) {
        close(__fd);
        return false;
      }
    }
    close(__fd);
    buf_local._7_1_ = true;
  }
  return buf_local._7_1_;
}

Assistant:

static bool read_dev_urandom(char *buf, int len)
{
    int fd;
    int ngot, ret;

    fd = open("/dev/urandom", O_RDONLY);
    if (fd < 0)
        return false;

    ngot = 0;
    while (ngot < len) {
        ret = read(fd, buf+ngot, len-ngot);
        if (ret < 0) {
            close(fd);
            return false;
        }
        ngot += ret;
    }

    close(fd);

    return true;
}